

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

UtcDate * FIX::UtcDateConvertor::convert(UtcDate *__return_storage_ptr__,string *value)

{
  char *pcVar1;
  char *pcVar2;
  FieldConvertError *this;
  long lVar3;
  
  if (value->_M_string_length == 8) {
    pcVar2 = (value->_M_dataplus)._M_p;
    lVar3 = 0;
    do {
      if (lVar3 == 8) {
        if ((pcVar2[4] * 10 + (int)pcVar2[5]) - 0x21dU < 0xfffffff4) {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
        }
        else {
          if (0xffffffe0 < (pcVar2[6] * 10 + (int)pcVar2[7]) - 0x230U) {
            UtcDate::UtcDate(__return_storage_ptr__,pcVar2[6] * 10 + (int)pcVar2[7] + -0x210,
                             (int)pcVar2[5] + pcVar2[4] * 10 + -0x210,
                             ((*pcVar2 * 10 + (int)pcVar2[1]) * 10 + (int)pcVar2[2]) * 10 +
                             (int)pcVar2[3] + -0xd050);
            return __return_storage_ptr__;
          }
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
        }
        goto LAB_001c7f2b;
      }
      pcVar1 = pcVar2 + lVar3;
      lVar3 = lVar3 + 1;
    } while ((int)*pcVar1 - 0x30U < 10);
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
LAB_001c7f2b:
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value.size() != 8) {
      throw FieldConvertError(value);
    }

    int i = 0;
    for (int c = 0; c < 8; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }

    int year, mon, mday;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if (mon < 1 || 12 < mon) {
      throw FieldConvertError(value);
    }

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if (mday < 1 || 31 < mday) {
      throw FieldConvertError(value);
    }

    return UtcDateOnly(mday, mon, year);
  }